

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  undefined4 uVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  unsigned_long uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  size_t local_68;
  size_t local_60;
  undefined1 auVar41 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = r->_begin;
  auVar19._8_4_ = 0x7f800000;
  auVar19._0_8_ = 0x7f8000007f800000;
  auVar19._12_4_ = 0x7f800000;
  auVar39 = ZEXT1664(auVar19);
  auVar40._8_4_ = 0xff800000;
  auVar40._0_8_ = 0xff800000ff800000;
  auVar40._12_4_ = 0xff800000;
  auVar41 = ZEXT1664(auVar40);
  local_68 = 0;
  auVar47 = ZEXT816(0) << 0x40;
  auVar49._8_4_ = 0x7fffffff;
  auVar49._0_8_ = 0x7fffffff7fffffff;
  auVar49._12_4_ = 0x7fffffff;
  auVar50._8_4_ = 0xddccb9a2;
  auVar50._0_8_ = 0xddccb9a2ddccb9a2;
  auVar50._12_4_ = 0xddccb9a2;
  auVar51._8_4_ = 0x5dccb9a2;
  auVar51._0_8_ = 0x5dccb9a25dccb9a2;
  auVar51._12_4_ = 0x5dccb9a2;
  auVar52 = ZEXT1664(auVar40);
  auVar53 = ZEXT1664(auVar19);
  local_60 = k;
  do {
    if (r->_end <= uVar14) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = auVar53._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = auVar52._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar39._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar41._0_16_;
      __return_storage_ptr__->end = local_68;
      return __return_storage_ptr__;
    }
    pBVar4 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices
             .items;
    uVar3 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                               super_CurveGeometry.field_0x68 * uVar14);
    uVar17 = (ulong)(uVar3 + 3);
    if (uVar17 < (pBVar4->super_RawBufferView).num) {
      lVar13 = 0;
      do {
        if ((ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                    super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 == lVar13 + 0x38) {
          pcVar5 = (pBVar4->super_RawBufferView).ptr_ofs;
          sVar6 = (pBVar4->super_RawBufferView).stride;
          lVar16 = uVar3 * sVar6;
          fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                  maxRadiusScale;
          auVar19 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar5 + lVar16 + 0xc)));
          auVar20 = vbroadcastss_avx512vl(auVar19);
          lVar13 = (uVar3 + 1) * sVar6;
          auVar19 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar5 + lVar13 + 0xc)));
          auVar21 = vbroadcastss_avx512vl(auVar19);
          lVar11 = (uVar3 + 2) * sVar6;
          auVar19 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar5 + lVar11 + 0xc)));
          auVar22 = vbroadcastss_avx512vl(auVar19);
          lVar18 = uVar17 * sVar6;
          fVar1 = fVar1 * *(float *)(pcVar5 + lVar18 + 0xc);
          auVar25._4_4_ = fVar1;
          auVar25._0_4_ = fVar1;
          auVar25._8_4_ = fVar1;
          auVar25._12_4_ = fVar1;
          auVar25._16_4_ = fVar1;
          auVar25._20_4_ = fVar1;
          auVar25._24_4_ = fVar1;
          auVar25._28_4_ = fVar1;
          auVar23 = vmulps_avx512vl(auVar25,bezier_basis0._3944_32_);
          auVar23 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._2788_32_,auVar22);
          auVar23 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._1632_32_,auVar21);
          auVar23 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._476_32_,auVar20);
          auVar36._8_4_ = 0xff800000;
          auVar36._0_8_ = 0xff800000ff800000;
          auVar36._12_4_ = 0xff800000;
          auVar36._16_4_ = 0xff800000;
          auVar36._20_4_ = 0xff800000;
          auVar36._24_4_ = 0xff800000;
          auVar36._28_4_ = 0xff800000;
          auVar24 = vmaxps_avx512vl(auVar36,auVar23);
          auVar25 = vmulps_avx512vl(auVar25,bezier_basis0._8568_32_);
          auVar22 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._7412_32_,auVar22);
          auVar21 = vfmadd231ps_avx512vl(auVar22,bezier_basis0._6256_32_,auVar21);
          auVar20 = vfmadd231ps_avx512vl(auVar21,bezier_basis0._5100_32_,auVar20);
          auVar37._8_4_ = 0x3d638e39;
          auVar37._0_8_ = 0x3d638e393d638e39;
          auVar37._12_4_ = 0x3d638e39;
          auVar37._16_4_ = 0x3d638e39;
          auVar37._20_4_ = 0x3d638e39;
          auVar37._24_4_ = 0x3d638e39;
          auVar37._28_4_ = 0x3d638e39;
          auVar21._4_4_ = auVar20._4_4_ * 0.055555556;
          auVar21._0_4_ = auVar20._0_4_ * 0.055555556;
          auVar21._8_4_ = auVar20._8_4_ * 0.055555556;
          auVar21._12_4_ = auVar20._12_4_ * 0.055555556;
          auVar21._16_4_ = auVar20._16_4_ * 0.055555556;
          auVar21._20_4_ = auVar20._20_4_ * 0.055555556;
          auVar21._24_4_ = auVar20._24_4_ * 0.055555556;
          auVar21._28_4_ = auVar20._28_4_;
          auVar20 = vblendps_avx(auVar21,ZEXT1632(auVar47),1);
          auVar22 = vsubps_avx512vl(auVar23,auVar20);
          auVar20 = vblendps_avx(auVar21,ZEXT1632(auVar47),0x80);
          auVar21 = vaddps_avx512vl(auVar23,auVar20);
          auVar20 = vmaxps_avx512vl(auVar22,auVar21);
          auVar24 = vmaxps_avx512vl(auVar24,auVar20);
          uVar2 = *(undefined4 *)(pcVar5 + lVar16 + 8);
          auVar28._4_4_ = uVar2;
          auVar28._0_4_ = uVar2;
          auVar28._8_4_ = uVar2;
          auVar28._12_4_ = uVar2;
          auVar28._16_4_ = uVar2;
          auVar28._20_4_ = uVar2;
          auVar28._24_4_ = uVar2;
          auVar28._28_4_ = uVar2;
          auVar20 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar13 + 8)));
          auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar11 + 8)));
          auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar18 + 8)));
          auVar27 = vmulps_avx512vl(auVar26,bezier_basis0._3944_32_);
          auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._2788_32_,auVar25);
          auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._1632_32_,auVar20);
          auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._476_32_,auVar28);
          auVar26 = vmulps_avx512vl(auVar26,bezier_basis0._8568_32_);
          auVar25 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._7412_32_,auVar25);
          auVar20 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._6256_32_,auVar20);
          auVar20 = vfmadd231ps_avx512vl(auVar20,bezier_basis0._5100_32_,auVar28);
          uVar2 = *(undefined4 *)(pcVar5 + lVar11 + 4);
          auVar29._4_4_ = uVar2;
          auVar29._0_4_ = uVar2;
          auVar29._8_4_ = uVar2;
          auVar29._12_4_ = uVar2;
          auVar29._16_4_ = uVar2;
          auVar29._20_4_ = uVar2;
          auVar29._24_4_ = uVar2;
          auVar29._28_4_ = uVar2;
          auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar18 + 4)));
          auVar26 = vmulps_avx512vl(auVar25,bezier_basis0._3944_32_);
          auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._2788_32_,auVar29);
          auVar25 = vmulps_avx512vl(auVar25,bezier_basis0._8568_32_);
          auVar25 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._7412_32_,auVar29);
          uVar2 = *(undefined4 *)(pcVar5 + lVar11);
          auVar32._4_4_ = uVar2;
          auVar32._0_4_ = uVar2;
          auVar32._8_4_ = uVar2;
          auVar32._12_4_ = uVar2;
          auVar32._16_4_ = uVar2;
          auVar32._20_4_ = uVar2;
          auVar32._24_4_ = uVar2;
          auVar32._28_4_ = uVar2;
          auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar18)));
          auVar29 = vmulps_avx512vl(auVar28,bezier_basis0._3944_32_);
          auVar29 = vfmadd231ps_avx512vl(auVar29,auVar32,bezier_basis0._2788_32_);
          auVar28 = vmulps_avx512vl(auVar28,bezier_basis0._8568_32_);
          auVar30 = vmaxps_avx512vl(auVar36,auVar27);
          auVar31 = vmulps_avx512vl(auVar20,auVar37);
          auVar28 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._7412_32_,auVar32);
          auVar35 = ZEXT1632(auVar47);
          auVar20 = vblendps_avx(auVar31,auVar35,1);
          auVar32 = vsubps_avx512vl(auVar27,auVar20);
          auVar20 = vblendps_avx(auVar31,auVar35,0x80);
          auVar31 = vaddps_avx512vl(auVar27,auVar20);
          auVar20 = vmaxps_avx512vl(auVar32,auVar31);
          auVar30 = vmaxps_avx512vl(auVar30,auVar20);
          auVar20 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar13 + 4)));
          auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._1632_32_,auVar20);
          auVar20 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._6256_32_,auVar20);
          auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar16 + 4)));
          auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._476_32_,auVar25);
          auVar20 = vfmadd231ps_avx512vl(auVar20,bezier_basis0._5100_32_,auVar25);
          auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar13)));
          auVar29 = vfmadd231ps_avx512vl(auVar29,auVar25,bezier_basis0._1632_32_);
          auVar33 = vmaxps_avx512vl(auVar36,auVar26);
          auVar34 = vmulps_avx512vl(auVar20,auVar37);
          auVar25 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._6256_32_,auVar25);
          auVar20 = vblendps_avx(auVar34,auVar35,1);
          auVar28 = vsubps_avx512vl(auVar26,auVar20);
          auVar20 = vblendps_avx(auVar34,auVar35,0x80);
          auVar34 = vaddps_avx512vl(auVar26,auVar20);
          auVar20 = vmaxps_avx512vl(auVar28,auVar34);
          auVar33 = vmaxps_avx512vl(auVar33,auVar20);
          auVar20 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar16)));
          auVar29 = vfmadd231ps_avx512vl(auVar29,auVar20,bezier_basis0._476_32_);
          auVar35 = vmaxps_avx512vl(auVar36,auVar29);
          auVar20 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._5100_32_,auVar20);
          auVar25 = vmulps_avx512vl(auVar20,auVar37);
          auVar20 = vblendps_avx(auVar25,ZEXT1632(auVar47),1);
          auVar36 = vsubps_avx512vl(auVar29,auVar20);
          auVar20 = vblendps_avx(auVar25,ZEXT1632(auVar47),0x80);
          auVar25 = vaddps_avx512vl(auVar29,auVar20);
          auVar20 = vmaxps_avx512vl(auVar36,auVar25);
          auVar35 = vmaxps_avx512vl(auVar35,auVar20);
          auVar20 = vminps_avx512vl(auVar22,auVar21);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar21 = vminps_avx512vl(auVar37,auVar23);
          auVar38 = vminps_avx512vl(auVar21,auVar20);
          auVar20 = vminps_avx(auVar32,auVar31);
          auVar21 = vminps_avx512vl(auVar37,auVar27);
          auVar20 = vminps_avx(auVar21,auVar20);
          auVar21 = vminps_avx(auVar28,auVar34);
          auVar22 = vminps_avx512vl(auVar37,auVar26);
          auVar21 = vminps_avx(auVar22,auVar21);
          auVar22 = vminps_avx(auVar36,auVar25);
          auVar23 = vminps_avx512vl(auVar37,auVar29);
          auVar22 = vminps_avx(auVar23,auVar22);
          auVar23 = vshufps_avx(auVar22,auVar22,0xb1);
          auVar22 = vminps_avx(auVar22,auVar23);
          auVar23 = vshufpd_avx(auVar22,auVar22,5);
          auVar22 = vminps_avx(auVar22,auVar23);
          auVar19 = vminps_avx(auVar22._0_16_,auVar22._16_16_);
          auVar22 = vshufps_avx(auVar21,auVar21,0xb1);
          auVar21 = vminps_avx(auVar21,auVar22);
          auVar22 = vshufpd_avx(auVar21,auVar21,5);
          auVar21 = vminps_avx(auVar21,auVar22);
          auVar40 = vminps_avx(auVar21._0_16_,auVar21._16_16_);
          auVar40 = vunpcklps_avx(auVar19,auVar40);
          auVar21 = vshufps_avx(auVar20,auVar20,0xb1);
          auVar20 = vminps_avx(auVar20,auVar21);
          auVar21 = vshufpd_avx(auVar20,auVar20,5);
          auVar20 = vminps_avx(auVar20,auVar21);
          auVar19 = vminps_avx(auVar20._0_16_,auVar20._16_16_);
          auVar43 = vinsertps_avx(auVar40,auVar19,0x28);
          auVar20 = vshufps_avx512vl(auVar35,auVar35,0xb1);
          auVar21 = vmaxps_avx512vl(auVar35,auVar20);
          auVar20 = vshufpd_avx(auVar21,auVar21,5);
          auVar20 = vmaxps_avx(auVar21,auVar20);
          auVar19 = vmaxps_avx(auVar20._0_16_,auVar20._16_16_);
          auVar20 = vshufps_avx512vl(auVar33,auVar33,0xb1);
          auVar21 = vmaxps_avx512vl(auVar33,auVar20);
          auVar20 = vshufpd_avx(auVar21,auVar21,5);
          auVar20 = vmaxps_avx(auVar21,auVar20);
          auVar40 = vmaxps_avx(auVar20._0_16_,auVar20._16_16_);
          auVar40 = vunpcklps_avx(auVar19,auVar40);
          auVar20 = vshufps_avx512vl(auVar30,auVar30,0xb1);
          auVar21 = vmaxps_avx512vl(auVar30,auVar20);
          auVar20 = vshufpd_avx(auVar21,auVar21,5);
          auVar20 = vmaxps_avx(auVar21,auVar20);
          auVar19 = vmaxps_avx(auVar20._0_16_,auVar20._16_16_);
          auVar45 = vinsertps_avx(auVar40,auVar19,0x28);
          auVar20 = vshufps_avx512vl(auVar38,auVar38,0xb1);
          auVar21 = vminps_avx512vl(auVar38,auVar20);
          auVar20 = vshufpd_avx(auVar21,auVar21,5);
          auVar20 = vminps_avx(auVar21,auVar20);
          auVar19 = vminss_avx(auVar20._0_16_,auVar20._16_16_);
          auVar20 = vshufps_avx(auVar24,auVar24,0xb1);
          auVar20 = vmaxps_avx(auVar24,auVar20);
          auVar21 = vshufpd_avx(auVar20,auVar20,5);
          auVar20 = vmaxps_avx(auVar20,auVar21);
          auVar40 = vmaxss_avx(auVar20._0_16_,auVar20._16_16_);
          auVar48._8_4_ = 0x7fffffff;
          auVar48._0_8_ = 0x7fffffff7fffffff;
          auVar48._12_4_ = 0x7fffffff;
          auVar19 = vandps_avx(auVar19,auVar48);
          auVar40 = vandps_avx(auVar40,auVar48);
          auVar19 = vmaxss_avx(auVar40,auVar19);
          auVar44._0_4_ = auVar19._0_4_;
          auVar44._4_4_ = auVar44._0_4_;
          auVar44._8_4_ = auVar44._0_4_;
          auVar44._12_4_ = auVar44._0_4_;
          auVar43 = vsubps_avx(auVar43,auVar44);
          auVar42._0_4_ = auVar45._0_4_ + auVar44._0_4_;
          auVar42._4_4_ = auVar45._4_4_ + auVar44._0_4_;
          auVar42._8_4_ = auVar45._8_4_ + auVar44._0_4_;
          auVar42._12_4_ = auVar45._12_4_ + auVar44._0_4_;
          auVar19 = vandps_avx(auVar43,auVar48);
          auVar40 = vandps_avx(auVar42,auVar48);
          auVar19 = vmaxps_avx(auVar19,auVar40);
          auVar40 = vmovshdup_avx(auVar19);
          auVar40 = vmaxss_avx(auVar40,auVar19);
          auVar19 = vshufpd_avx(auVar19,auVar19,1);
          auVar19 = vmaxss_avx(auVar19,auVar40);
          fVar1 = auVar19._0_4_ * 4.7683716e-07;
          auVar45._4_4_ = fVar1;
          auVar45._0_4_ = fVar1;
          auVar45._8_4_ = fVar1;
          auVar45._12_4_ = fVar1;
          auVar19 = vsubps_avx(auVar43,auVar45);
          aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar19,ZEXT416(geomID),0x30);
          auVar43._0_4_ = auVar42._0_4_ + fVar1;
          auVar43._4_4_ = auVar42._4_4_ + fVar1;
          auVar43._8_4_ = auVar42._8_4_ + fVar1;
          auVar43._12_4_ = auVar42._12_4_ + fVar1;
          aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar43,ZEXT416((uint)uVar14),0x30);
          auVar46._0_4_ = aVar7.x + aVar8.x;
          auVar46._4_4_ = aVar7.y + aVar8.y;
          auVar46._8_4_ = aVar7.z + aVar8.z;
          auVar46._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
          auVar19 = vminps_avx((undefined1  [16])auVar39._0_16_,auVar46);
          auVar39 = ZEXT1664(auVar19);
          auVar19 = vmaxps_avx((undefined1  [16])auVar41._0_16_,auVar46);
          auVar41 = ZEXT1664(auVar19);
          auVar19 = vmaxps_avx((undefined1  [16])auVar52._0_16_,(undefined1  [16])aVar8);
          auVar52 = ZEXT1664(auVar19);
          prims[local_60].upper.field_0.field_1 = aVar8;
          auVar19 = vminps_avx((undefined1  [16])auVar53._0_16_,(undefined1  [16])aVar7);
          auVar53 = ZEXT1664(auVar19);
          prims[local_60].lower.field_0.field_1 = aVar7;
          local_68 = local_68 + 1;
          local_60 = local_60 + 1;
          break;
        }
        lVar16 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar13);
        lVar18 = *(long *)((long)&(pBVar4->super_RawBufferView).stride + lVar13);
        lVar11 = lVar18 * (ulong)uVar3;
        auVar19 = vandps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar11)),auVar49);
        if (1.844e+18 <= auVar19._0_4_) break;
        lVar15 = lVar18 * (ulong)(uVar3 + 1);
        auVar19 = vandps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar15)),auVar49);
        if (1.844e+18 <= auVar19._0_4_) break;
        lVar12 = lVar18 * (ulong)(uVar3 + 2);
        auVar19 = vandps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar12)),auVar49);
        if (1.844e+18 <= auVar19._0_4_) break;
        auVar19 = vandps_avx(ZEXT416(*(uint *)(lVar16 + 0xc + lVar18 * uVar17)),auVar49);
        if (1.844e+18 <= auVar19._0_4_) break;
        auVar19 = *(undefined1 (*) [16])(lVar16 + lVar11);
        uVar9 = vcmpps_avx512vl(auVar19,auVar50,6);
        uVar10 = vcmpps_avx512vl(auVar19,auVar51,1);
        if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) break;
        auVar19 = *(undefined1 (*) [16])(lVar16 + lVar15);
        uVar9 = vcmpps_avx512vl(auVar19,auVar50,6);
        uVar10 = vcmpps_avx512vl(auVar19,auVar51,1);
        if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) break;
        auVar19 = *(undefined1 (*) [16])(lVar16 + lVar12);
        uVar9 = vcmpps_avx512vl(auVar19,auVar50,6);
        uVar10 = vcmpps_avx512vl(auVar19,auVar51,1);
        if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) break;
        auVar19 = *(undefined1 (*) [16])(lVar16 + lVar18 * uVar17);
        uVar9 = vcmpps_avx512vl(auVar19,auVar50,6);
        uVar10 = vcmpps_avx512vl(auVar19,auVar51,1);
        lVar13 = lVar13 + 0x38;
      } while ((~((ushort)uVar9 & (ushort)uVar10) & 7) == 0);
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }